

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopFocusScope(void)

{
  ImGuiContext *pIVar1;
  ImGuiFocusScopeData *pIVar2;
  ImGuiContext *g;
  ImGuiID local_c;
  
  pIVar1 = GImGui;
  if ((GImGui->FocusScopeStack).Size != 0) {
    ImVector<ImGuiFocusScopeData>::pop_back(&GImGui->FocusScopeStack);
    if ((pIVar1->FocusScopeStack).Size == 0) {
      local_c = 0;
    }
    else {
      pIVar2 = ImVector<ImGuiFocusScopeData>::back(&pIVar1->FocusScopeStack);
      local_c = pIVar2->ID;
    }
    pIVar1->CurrentFocusScopeId = local_c;
  }
  return;
}

Assistant:

void ImGui::PopFocusScope()
{
    ImGuiContext& g = *GImGui;
    if (g.FocusScopeStack.Size == 0)
    {
        IM_ASSERT_USER_ERROR(g.FocusScopeStack.Size > 0, "Calling PopFocusScope() too many times!");
        return;
    }
    g.FocusScopeStack.pop_back();
    g.CurrentFocusScopeId = g.FocusScopeStack.Size ? g.FocusScopeStack.back().ID : 0;
}